

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.cpp
# Opt level: O1

QString * sectionTypeToUString(QString *__return_storage_ptr__,UINT8 type)

{
  int iVar1;
  undefined7 in_register_00000031;
  storage_type *psVar2;
  QByteArrayView QVar3;
  Data *local_28;
  char16_t *local_20;
  qsizetype local_18;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 1:
    goto LAB_00164686;
  case 2:
    goto LAB_00164697;
  case 3:
    goto LAB_00164686;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x1a:
  case 0x1d:
  case 0x1e:
  case 0x1f:
switchD_001645d3_caseD_4:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",type);
    return __return_storage_ptr__;
  case 0x10:
LAB_00164686:
    psVar2 = (storage_type *)0xa;
    break;
  case 0x11:
    psVar2 = (storage_type *)0x9;
    break;
  case 0x12:
    psVar2 = (storage_type *)0x8;
    break;
  case 0x13:
    goto LAB_001646d3;
  case 0x14:
    psVar2 = (storage_type *)0x7;
    break;
  case 0x15:
    psVar2 = (storage_type *)0x2;
    break;
  case 0x16:
    goto LAB_00164697;
  case 0x17:
LAB_00164697:
    psVar2 = (storage_type *)0xc;
    break;
  case 0x18:
    psVar2 = (storage_type *)0x15;
    break;
  case 0x19:
    psVar2 = (storage_type *)0x3;
    break;
  case 0x1b:
LAB_001646d3:
    psVar2 = (storage_type *)0xe;
    break;
  case 0x1c:
    psVar2 = (storage_type *)0xd;
    break;
  case 0x20:
    psVar2 = (storage_type *)0xf;
    break;
  default:
    if (iVar1 != 0xf0) goto switchD_001645d3_caseD_4;
    psVar2 = (storage_type *)0x10;
  }
  QVar3.m_data = psVar2;
  QVar3.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar3);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = local_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

UString sectionTypeToUString(const UINT8 type)
{
    switch (type) {
        case EFI_SECTION_COMPRESSION:               return UString("Compressed");
        case EFI_SECTION_GUID_DEFINED:              return UString("GUID defined");
        case EFI_SECTION_DISPOSABLE:                return UString("Disposable");
        case EFI_SECTION_PE32:                      return UString("PE32 image");
        case EFI_SECTION_PIC:                       return UString("PIC image");
        case EFI_SECTION_TE:                        return UString("TE image");
        case EFI_SECTION_DXE_DEPEX:                 return UString("DXE dependency");
        case EFI_SECTION_VERSION:                   return UString("Version");
        case EFI_SECTION_USER_INTERFACE:            return UString("UI");
        case EFI_SECTION_COMPATIBILITY16:           return UString("16-bit image");
        case EFI_SECTION_FIRMWARE_VOLUME_IMAGE:     return UString("Volume image");
        case EFI_SECTION_FREEFORM_SUBTYPE_GUID:     return UString("Freeform subtype GUID");
        case EFI_SECTION_RAW:                       return UString("Raw");
        case EFI_SECTION_PEI_DEPEX:                 return UString("PEI dependency");
        case EFI_SECTION_MM_DEPEX:                  return UString("MM dependency");
        case INSYDE_SECTION_POSTCODE:               return UString("Insyde postcode");
        case PHOENIX_SECTION_POSTCODE:              return UString("Phoenix postcode");
    }
    return usprintf("Unknown %02Xh", type);
}